

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansicolor_sink-inl.h
# Opt level: O2

void __thiscall
spdlog::sinks::ansicolor_sink<spdlog::details::console_mutex>::set_color
          (ansicolor_sink<spdlog::details::console_mutex> *this,level_enum color_level,
          string_view_t color)

{
  pthread_mutex_t *__mutex;
  mapped_type *pmVar1;
  level_enum local_2c;
  
  __mutex = (pthread_mutex_t *)this->mutex_;
  local_2c = color_level;
  std::mutex::lock((mutex *)&__mutex->__data);
  pmVar1 = std::__detail::
           _Map_base<spdlog::level::level_enum,_std::pair<const_spdlog::level::level_enum,_fmt::v6::basic_string_view<char>_>,_std::allocator<std::pair<const_spdlog::level::level_enum,_fmt::v6::basic_string_view<char>_>_>,_std::__detail::_Select1st,_std::equal_to<spdlog::level::level_enum>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<spdlog::level::level_enum,_std::pair<const_spdlog::level::level_enum,_fmt::v6::basic_string_view<char>_>,_std::allocator<std::pair<const_spdlog::level::level_enum,_fmt::v6::basic_string_view<char>_>_>,_std::__detail::_Select1st,_std::equal_to<spdlog::level::level_enum>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->colors_,&local_2c);
  pmVar1->data_ = color.data_;
  pmVar1->size_ = color.size_;
  pthread_mutex_unlock(__mutex);
  return;
}

Assistant:

SPDLOG_INLINE void ansicolor_sink<ConsoleMutex>::set_color(level::level_enum color_level, string_view_t color)
{
    std::lock_guard<mutex_t> lock(mutex_);
    colors_[color_level] = color;
}